

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O0

void __thiscall
SuiteSessionTests::sessionFixtureTimeIsOutsideSessionTimeHelper::RunImpl
          (sessionFixtureTimeIsOutsideSessionTimeHelper *this)

{
  int64_t *this_00;
  TestResults *this_01;
  bool bVar1;
  TestResults **ppTVar2;
  TestDetails **ppTVar3;
  TestDetails local_b8;
  undefined1 local_98 [8];
  UtcTimeStamp outsideSessionTime;
  UtcTimeOnly local_68;
  undefined1 local_40 [8];
  UtcTimeStamp fixedEndTime;
  UtcTimeStamp fixedStartTime;
  sessionFixtureTimeIsOutsideSessionTimeHelper *this_local;
  
  FIX::UtcTimeStamp::UtcTimeStamp
            ((UtcTimeStamp *)&fixedEndTime.super_DateTime.m_time,8,8,8,5,0xd,0x7e3);
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)local_40,0x10,0x10,0x10,5,0xd,0x7e3);
  FIX::UtcTimeOnly::UtcTimeOnly(&local_68,(DateTime *)&fixedEndTime.super_DateTime.m_time);
  FIX::UtcTimeOnly::operator=(&(this->super_sessionFixture).super_TestCallback.startTime,&local_68);
  FIX::UtcTimeOnly::~UtcTimeOnly(&local_68);
  FIX::UtcTimeOnly::UtcTimeOnly
            ((UtcTimeOnly *)&outsideSessionTime.super_DateTime.m_time,(DateTime *)local_40);
  this_00 = &outsideSessionTime.super_DateTime.m_time;
  FIX::UtcTimeOnly::operator=
            (&(this->super_sessionFixture).super_TestCallback.endTime,(UtcTimeOnly *)this_00);
  FIX::UtcTimeOnly::~UtcTimeOnly((UtcTimeOnly *)this_00);
  (*(this->super_sessionFixture).super_TestCallback.super_Responder._vptr_Responder[8])
            (this,1,0xffffffff);
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)local_98,0x14,0x14,0x14,5,0xd,0x7e3);
  bVar1 = FIX::Session::isSessionTime((this->super_sessionFixture).object,(UtcTimeStamp *)local_98);
  bVar1 = UnitTest::Check<bool>((bool)(~bVar1 & 1));
  if (!bVar1) {
    ppTVar2 = UnitTest::CurrentTest::Results();
    this_01 = *ppTVar2;
    ppTVar3 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_b8,*ppTVar3,0x65f);
    UnitTest::TestResults::OnTestFailure
              (this_01,&local_b8,"!object->isSessionTime(outsideSessionTime)");
  }
  FIX::UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)local_98);
  FIX::UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)local_40);
  FIX::UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)&fixedEndTime.super_DateTime.m_time);
  return;
}

Assistant:

TEST_FIXTURE(sessionFixture, TimeIsOutsideSessionTime) {
  UtcTimeStamp fixedStartTime = UtcTimeStamp(8, 8, 8, 5, 13, 2019);
  UtcTimeStamp fixedEndTime = UtcTimeStamp(16, 16, 16, 5, 13, 2019);

  startTime = UtcTimeOnly( fixedStartTime );
  endTime = UtcTimeOnly( fixedEndTime );
  createSession(1);

  UtcTimeStamp outsideSessionTime = UtcTimeStamp(20, 20, 20, 5, 13, 2019);

  CHECK(!object->isSessionTime(outsideSessionTime));
}